

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::compute_quotient_into(char *new_ext,char *new_rem_ext,char *ext1,char *ext2)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined1 auVar5 [12];
  err_frame_t *peVar6;
  CVmException *pCVar7;
  int16_t tmp_1;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined8 *puVar11;
  long *plVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint pair;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  char *pcVar26;
  ulong i;
  char *pcVar27;
  char *pcVar28;
  uint uVar33;
  undefined1 in_XMM3 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar34;
  undefined1 auVar32 [16];
  char *rem_ext;
  ushort local_162;
  char *rem_ext2;
  char *local_158;
  char *dvs_ext;
  int local_148;
  uint dvs_hdl2;
  uint rem_hdl2;
  uint rem_hdl;
  char *local_138;
  char *local_130;
  char *dvs_ext2;
  int local_120;
  uint dvs_hdl;
  char *local_118;
  err_frame_t err_cur__;
  
  if ((ext2[4] & 8U) != 0) {
    err_throw(0x7d8);
  }
  if ((ext1[4] & 8U) != 0) {
    set_zero(new_ext);
    if (new_rem_ext == (char *)0x0) {
      return;
    }
    set_zero(new_rem_ext);
    return;
  }
  uVar1 = *(ushort *)new_ext;
  uVar2 = *(ushort *)ext2;
  uVar10 = (uint)uVar2;
  uVar22 = uVar10;
  if (uVar2 < *(ushort *)ext1) {
    uVar22 = (uint)*(ushort *)ext1;
  }
  local_158 = new_ext;
  local_138 = ext2;
  local_130 = ext1;
  alloc_temp_regs((ulong)(uVar22 + ((short)uVar22 == 0) & 0xffff) + 2,3,&rem_ext,&rem_hdl,&rem_ext2,
                  &rem_hdl2,&dvs_ext2);
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar11;
  plVar12 = (long *)_ZTW11G_err_frame();
  *plVar12 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    alloc_temp_regs((ulong)uVar10,1,&dvs_ext,&dvs_hdl);
  }
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
    release_temp_regs(3,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl2);
    err_rethrow();
  }
  peVar6 = err_cur__.prv_;
  puVar11 = (undefined8 *)_ZTW11G_err_frame();
  *puVar11 = peVar6;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar11 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar11 & 2) != 0) {
      plVar12 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar12 + 0x10));
    }
    pCVar7 = err_cur__.exc_;
    plVar12 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar12 + 0x10) = pCVar7;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  pcVar15 = local_130;
  copy_val(rem_ext,local_130,1);
  pcVar26 = local_138;
  copy_val(dvs_ext,local_138,1);
  iVar8 = (int)*(short *)(pcVar15 + 2) - (int)*(short *)(pcVar26 + 2);
  *(short *)(dvs_ext + 2) = *(short *)(pcVar15 + 2);
  if (-1 < iVar8 || new_rem_ext == (char *)0x0) {
    uVar16 = (ulong)uVar1;
    iVar8 = iVar8 + 1;
    iVar14 = 0;
    i = 0;
    local_162 = uVar2;
    local_118 = new_rem_ext;
    do {
      pcVar26 = local_118;
      iVar18 = (uint)((byte)dvs_ext[5] >> 4) * 100;
      if (((ushort)uVar10 < 2) ||
         (iVar18 = iVar18 + ((byte)dvs_ext[5] & 0xf) * 10, (ushort)uVar10 == 2)) {
        uVar22 = 0;
      }
      else {
        uVar22 = (uint)((byte)dvs_ext[6] >> 4);
      }
      iVar9 = (uint)((byte)rem_ext[6] >> 4) + ((byte)rem_ext[5] & 0xf) * 10 +
              (uint)((byte)rem_ext[5] >> 4) * 100;
      iVar18 = uVar22 + iVar18 + 1;
      iVar19 = (int)*(short *)(rem_ext + 2);
      iVar23 = (int)*(short *)(dvs_ext + 2);
      iVar24 = iVar19 - iVar23;
      if (iVar24 == 0 || iVar19 < iVar23) {
        if (iVar24 < -2) {
          iVar18 = 1000;
        }
        else if (iVar24 < 0) {
          uVar22 = (iVar23 - iVar19) - 1;
          auVar5._4_8_ = in_XMM3._8_8_;
          auVar5._0_4_ = 1;
          auVar29._0_8_ = auVar5._0_8_ << 0x20;
          auVar29._8_4_ = 1;
          auVar29._12_4_ = 1;
          auVar30._4_12_ = auVar29._4_12_;
          auVar30._0_4_ = iVar18;
          iVar18 = 4;
          do {
            uVar10 = auVar30._0_4_;
            auVar31._4_4_ = auVar30._4_4_;
            uVar33 = auVar30._8_4_;
            auVar31._12_4_ = auVar30._12_4_;
            iVar24 = uVar10 * 10;
            iVar4 = uVar33 * 10;
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            uVar34 = (undefined4)((auVar31._8_8_ & 0xffffffff) * 10);
            iVar20 = iVar18 + -4;
            iVar25 = ((iVar23 - iVar19) + 3U & 0xfffffffc) + iVar18;
            auVar30._4_4_ = auVar31._4_4_ * 10;
            auVar30._0_4_ = iVar24;
            auVar30._8_4_ = iVar4;
            auVar30._12_4_ = uVar34;
            iVar18 = iVar20;
          } while (iVar25 != 8);
          uVar21 = -iVar20;
          auVar32._0_4_ = -(uint)((int)(uVar22 ^ 0x80000000) < (int)(uVar21 ^ 0x80000000));
          auVar32._4_4_ = -(uint)((int)(uVar22 ^ 0x80000000) < (int)((uVar21 | 1) ^ 0x80000000));
          auVar32._8_4_ = -(uint)((int)(uVar22 ^ 0x80000000) < (int)((uVar21 | 2) ^ 0x80000000));
          auVar32._12_4_ = -(uint)((int)(uVar22 ^ 0x80000000) < (int)((uVar21 | 3) ^ 0x80000000));
          in_XMM3._0_4_ = uVar10 & auVar32._0_4_;
          in_XMM3._4_4_ = auVar31._4_4_ & auVar32._4_4_;
          in_XMM3._8_4_ = uVar33 & auVar32._8_4_;
          in_XMM3._12_4_ = auVar31._12_4_ & auVar32._12_4_;
          auVar3._4_4_ = auVar31._4_4_ * 10;
          auVar3._0_4_ = iVar24;
          auVar3._8_4_ = iVar4;
          auVar3._12_4_ = uVar34;
          in_XMM3 = ~auVar32 & auVar3 | in_XMM3;
          iVar18 = in_XMM3._8_4_ * in_XMM3._0_4_ * in_XMM3._4_4_ * in_XMM3._12_4_;
        }
      }
      else {
        for (; 0 < iVar24; iVar24 = iVar24 + -1) {
          iVar9 = iVar9 * 10;
        }
      }
      uVar10 = iVar9 / iVar18;
      uVar22 = 0;
      local_120 = iVar14;
      if (2 < (int)uVar10) {
        copy_val(dvs_ext2,dvs_ext,0);
        mul_by_long(dvs_ext2,(ulong)uVar10);
        compute_abs_diff_into(rem_ext2,rem_ext,dvs_ext2);
        pcVar15 = rem_ext;
        if ((rem_ext2[4] & 8U) != 0) {
          pcVar15 = local_158;
          pcVar27 = local_138;
          pcVar28 = local_130;
          if (pcVar26 != (char *)0x0) goto LAB_002638fc;
          goto LAB_00263934;
        }
        rem_ext = rem_ext2;
        rem_ext2 = pcVar15;
        uVar22 = uVar10;
      }
      while( true ) {
        local_148 = iVar8;
        pcVar27 = dvs_ext;
        pcVar26 = rem_ext;
        iVar18 = compare_abs(rem_ext,dvs_ext);
        pcVar15 = local_158;
        if (iVar18 < 0) break;
        if (iVar18 == 0) {
          uVar22 = uVar22 + 1;
          iVar8 = 0;
          goto LAB_002637d6;
        }
        compute_abs_diff_into(rem_ext2,pcVar26,pcVar27);
        pcVar26 = rem_ext;
        rem_ext = rem_ext2;
        uVar22 = uVar22 + 1;
        rem_ext2 = pcVar26;
        iVar8 = local_148;
      }
      iVar8 = 1;
LAB_002637d6:
      if (i < uVar16) {
        set_dig(local_158,i,uVar22);
      }
      else if (i == uVar16) {
        *(short *)(local_158 + 2) = (short)local_148;
        round_for_dropped_digits(local_158,uVar22,iVar8);
        goto LAB_002638f2;
      }
      iVar14 = local_120;
      if (uVar22 != 0) {
        iVar14 = 1;
      }
      uVar13 = (iVar14 != 0) + i;
      iVar8 = local_148 - (uint)(iVar14 == 0);
      if ((-1 < iVar18) ||
         ((local_118 != (char *)0x0 && ((uVar13 == uVar16 || (iVar8 == (int)uVar13))))))
      goto LAB_00263869;
      *(short *)(dvs_ext + 2) = *(short *)(dvs_ext + 2) + -1;
      uVar10 = (uint)local_162;
      i = uVar13;
    } while( true );
  }
  copy_val(new_rem_ext,rem_ext,1);
  set_zero(local_158);
LAB_00263952:
  release_temp_regs(4,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl,(ulong)dvs_hdl2);
  return;
LAB_00263869:
  bVar17 = (((char)i + '\x01') - (iVar14 == 0)) * '\x04';
  for (; uVar13 < uVar16; uVar13 = uVar13 + 1) {
    local_158[(uVar13 >> 1) + 5] = local_158[(uVar13 >> 1) + 5] & '\x0f' << (bVar17 & 4);
    bVar17 = bVar17 + 4;
  }
  *(short *)(local_158 + 2) = (short)iVar8;
  pcVar15 = local_158;
LAB_002638f2:
  pcVar26 = local_118;
  pcVar28 = local_130;
  pcVar27 = local_138;
  if (local_118 != (char *)0x0) {
    if (iVar18 < 0) {
      copy_val(local_118,rem_ext,1);
      pcVar26[4] = pcVar26[4] & 0xfeU | pcVar28[4] & 1U;
      normalize(pcVar26);
    }
    else {
LAB_002638fc:
      pcVar28 = local_130;
      pcVar27 = local_138;
      set_zero(pcVar26);
    }
  }
LAB_00263934:
  pcVar15[4] = pcVar15[4] & 0xfeU | (pcVar27[4] ^ pcVar28[4]) & 1U;
  normalize(pcVar15);
  goto LAB_00263952;
}

Assistant:

void CVmObjBigNum::compute_quotient_into(char *new_ext,
                                         char *new_rem_ext,
                                         const char *ext1, const char *ext2)
{
    char *rem_ext;
    uint rem_hdl;
    char *rem_ext2;
    uint rem_hdl2;
    int quo_exp;
    size_t quo_idx;
    size_t quo_prec = get_prec(new_ext);
    size_t dvd_prec = get_prec(ext1);
    size_t dvs_prec = get_prec(ext2);
    char *dvs_ext;
    uint dvs_hdl;
    char *dvs_ext2;
    uint dvs_hdl2;
    int lead_dig_set;
    int zero_remainder;
    int acc;
    size_t rem_prec;

    /* if the divisor is zero, throw an error */
    if (is_zero(ext2))
        err_throw(VMERR_DIVIDE_BY_ZERO);

    /* if the dividend is zero, the result is zero */
    if (is_zero(ext1))
    {
        /* set the result to zero */
        set_zero(new_ext);

        /* if they want the remainder, it's zero also */
        if (new_rem_ext != 0)
            set_zero(new_rem_ext);

        /* we're done */
        return;
    }

    /* 
     *   Calculate the precision we need for the running remainder.  We
     *   must retain enough precision in the remainder to calculate exact
     *   differences, so we need the greater of the precisions of the
     *   dividend and the divisor, plus enough extra digits for the
     *   maximum relative shifting.  We'll have to shift at most one
     *   extra digit, but use two to be extra safe.  
     */
    rem_prec = dvd_prec;
    if (rem_prec < dvs_prec)
        rem_prec = dvs_prec;
    rem_prec += 2;

    /*   
     *   Make sure the precision is at least three, since it simplifies
     *   our digit approximation calculation.  
     */
    if (rem_prec < 3)
        rem_prec = 3;

    /* 
     *   Allocate two temporary registers for the running remainder, and
     *   one more for the multiplied divisor.  Note that we allocate the
     *   multiplied divisor at our higher precision so that we don't lose
     *   digits in our multiplier calculations.  
     */
    alloc_temp_regs(rem_prec, 3,
                    &rem_ext, &rem_hdl, &rem_ext2, &rem_hdl2,
                    &dvs_ext2, &dvs_hdl2);

    /* 
     *   Allocate another temp register for the shifted divisor.  Note
     *   that we need a different precision here, which is why we must
     *   make a separate allocation call 
     */
    err_try
    {
        /* make the additional allocation */
        alloc_temp_regs(dvs_prec, 1, &dvs_ext, &dvs_hdl);
    }